

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O1

void duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::InitializeFileScanState
               (ClientContext *context,MultiFileReaderData *reader_data,MultiFileLocalState *lstate,
               vector<unsigned_long,_true> *projection_ids)

{
  shared_ptr<duckdb::BaseFileReader,_true> *this;
  _Hash_node_base *__n;
  ulong uVar1;
  __node_base_ptr p_Var2;
  size_type *psVar3;
  pointer puVar4;
  type pBVar5;
  BaseFileReader *pBVar6;
  reference pvVar7;
  __node_base_ptr p_Var8;
  pointer pEVar9;
  const_reference pvVar10;
  reference this_00;
  type pEVar11;
  ulong uVar12;
  ExpressionExecutor *this_01;
  _Hash_node_base *p_Var13;
  value_type *__x;
  _Hash_node_base *p_Var14;
  __node_base_ptr p_Var15;
  iterator __begin3;
  size_type __n_00;
  size_type *psVar16;
  pointer this_02;
  vector<duckdb::LogicalType,_true> intermediate_chunk_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  vector<unsigned_long,_true> *local_40;
  ClientContext *local_38;
  
  this = &lstate->reader;
  local_40 = projection_ids;
  local_38 = context;
  shared_ptr<duckdb::BaseFileReader,_true>::operator=(this,&reader_data->reader);
  (lstate->reader_data).ptr = reader_data;
  pBVar5 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(this);
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar6 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(this);
  if ((pBVar5->column_ids).column_ids.
      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pBVar5->column_ids).column_ids.
      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>.
      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar7 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                         (&(pBVar5->column_ids).column_ids,__n_00);
      __n = (_Hash_node_base *)pvVar7->column_id;
      uVar1 = (pBVar5->cast_map)._M_h._M_bucket_count;
      uVar12 = (ulong)__n % uVar1;
      p_Var2 = (pBVar5->cast_map)._M_h._M_buckets[uVar12];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var8 = p_Var2, p_Var15 = p_Var2->_M_nxt, __n != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var13 = p_Var15->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)p_Var13[1]._M_nxt % uVar1 != uVar12) ||
             (p_Var8 = p_Var15, p_Var15 = p_Var13, __n == p_Var13[1]._M_nxt)) goto LAB_01088150;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_01088150:
      if (p_Var8 == (__node_base_ptr)0x0) {
        p_Var13 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var13 = p_Var8->_M_nxt;
      }
      uVar1 = (pBVar5->expression_map)._M_h._M_bucket_count;
      uVar12 = (ulong)__n % uVar1;
      p_Var2 = (pBVar5->expression_map)._M_h._M_buckets[uVar12];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var8 = p_Var2, p_Var15 = p_Var2->_M_nxt, __n != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var14 = p_Var15->_M_nxt, p_Var14 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)p_Var14[1]._M_nxt % uVar1 != uVar12) ||
             (p_Var8 = p_Var15, p_Var15 = p_Var14, __n == p_Var14[1]._M_nxt)) goto LAB_010881bc;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_010881bc:
      if (p_Var8 == (__node_base_ptr)0x0) {
        p_Var14 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var14 = p_Var8->_M_nxt;
      }
      if (p_Var13 == (_Hash_node_base *)0x0) {
        if (p_Var14 != (_Hash_node_base *)0x0) {
          pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)(p_Var14 + 2));
          __x = &pEVar9->return_type;
          goto LAB_010881e8;
        }
        pvVar10 = vector<duckdb::MultiFileColumnDefinition,_true>::operator[]
                            (&pBVar6->columns,(size_type)__n);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_58,&pvVar10->type);
      }
      else {
        __x = (value_type *)(p_Var13 + 2);
LAB_010881e8:
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_58,__x);
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(pBVar5->column_ids).column_ids.
                                    super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                    .
                                    super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pBVar5->column_ids).column_ids.
                                    super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                    .
                                    super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  DataChunk::Destroy(&lstate->scan_chunk);
  DataChunk::Initialize
            (&lstate->scan_chunk,local_38,(vector<duckdb::LogicalType,_true> *)&local_58,0x800);
  this_01 = &lstate->executor;
  ExpressionExecutor::ClearExpressions(this_01);
  psVar16 = (local_40->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  psVar3 = (local_40->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar16 == psVar3) {
    puVar4 = (reader_data->expressions).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (reader_data->expressions).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar4;
        this_02 = this_02 + 1) {
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_02);
      ExpressionExecutor::AddExpression(this_01,pEVar11);
    }
  }
  else {
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&reader_data->expressions,*psVar16);
      pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_00);
      ExpressionExecutor::AddExpression(this_01,pEVar11);
      psVar16 = psVar16 + 1;
    } while (psVar16 != psVar3);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  return;
}

Assistant:

static void InitializeFileScanState(ClientContext &context, MultiFileReaderData &reader_data,
	                                    MultiFileLocalState &lstate, vector<idx_t> &projection_ids) {
		lstate.reader = reader_data.reader;
		lstate.reader_data = reader_data;
		auto &reader = *lstate.reader;
		//! Initialize the intermediate chunk to be used by the underlying reader before being finalized
		vector<LogicalType> intermediate_chunk_types;
		auto &local_column_ids = reader.column_ids;
		auto &local_columns = lstate.reader->GetColumns();
		for (idx_t i = 0; i < local_column_ids.size(); i++) {
			auto local_idx = MultiFileLocalIndex(i);
			auto local_id = local_column_ids[local_idx];
			auto cast_entry = reader.cast_map.find(local_id);
			auto expr_entry = reader.expression_map.find(local_id);
			if (cast_entry != reader.cast_map.end()) {
				intermediate_chunk_types.push_back(cast_entry->second);
			} else if (expr_entry != reader.expression_map.end()) {
				intermediate_chunk_types.push_back(expr_entry->second->return_type);
			} else {
				auto &col = local_columns[local_id];
				intermediate_chunk_types.push_back(col.type);
			}
		}
		lstate.scan_chunk.Destroy();
		lstate.scan_chunk.Initialize(context, intermediate_chunk_types);

		auto &executor = lstate.executor;
		executor.ClearExpressions();
		if (!projection_ids.empty()) {
			for (auto &id : projection_ids) {
				executor.AddExpression(*reader_data.expressions[id]);
			}
		} else {
			for (auto &expr : reader_data.expressions) {
				executor.AddExpression(*expr);
			}
		}
	}